

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O3

void udata_writeUString(UNewDataMemory *pData,UChar *s,int32_t length)

{
  if ((pData != (UNewDataMemory *)0x0) && (pData->file != (FileStream *)0x0)) {
    if (length == -1) {
      length = u_strlen_63(s);
    }
    if (0 < length) {
      T_FileStream_write(pData->file,s,length * 2);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_writeUString(UNewDataMemory *pData, const UChar *s, int32_t length) {
    if(pData!=NULL && pData->file!=NULL) {
        if(length==-1) {
            length=u_strlen(s);
        }
        if(length>0) {
            T_FileStream_write(pData->file, s, length*sizeof(UChar));
        }
    }
}